

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SequenceRepeatLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_sequencerepeat
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  SequenceRepeatLayerParams *pSVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_sequencerepeat(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_sequencerepeat(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::SequenceRepeatLayerParams>(arena);
    (this->layer_).sequencerepeat_ = pSVar2;
  }
  return (SequenceRepeatLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SequenceRepeatLayerParams* NeuralNetworkLayer::_internal_mutable_sequencerepeat() {
  if (!_internal_has_sequencerepeat()) {
    clear_layer();
    set_has_sequencerepeat();
    layer_.sequencerepeat_ = CreateMaybeMessage< ::CoreML::Specification::SequenceRepeatLayerParams >(GetArenaForAllocation());
  }
  return layer_.sequencerepeat_;
}